

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setPivot(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int p_stage,int p_col,int p_row,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined8 uVar4;
  int iVar5;
  pointer pnVar6;
  long lVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar8;
  pointer pnVar9;
  undefined4 *puVar10;
  uint *puVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  undefined4 *puVar13;
  uint *puVar14;
  bool bVar15;
  byte bVar16;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  uint local_148 [3];
  undefined3 uStack_13b;
  int iStack_138;
  bool bStack_134;
  undefined8 local_130;
  cpp_dec_float<200U,_int,_void> local_128;
  undefined4 local_a0 [28];
  
  bVar16 = 0;
  (this->row).orig[p_stage] = p_row;
  (this->col).orig[p_stage] = p_col;
  (this->row).perm[p_row] = p_stage;
  (this->col).perm[p_col] = p_stage;
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 0x1c;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems[6] = 0;
  local_128.data._M_elems[7] = 0;
  local_128.data._M_elems[8] = 0;
  local_128.data._M_elems[9] = 0;
  local_128.data._M_elems[10] = 0;
  local_128.data._M_elems[0xb] = 0;
  local_128.data._M_elems[0xc] = 0;
  local_128.data._M_elems[0xd] = 0;
  local_128.data._M_elems[0xe] = 0;
  local_128.data._M_elems[0xf] = 0;
  local_128.data._M_elems[0x10] = 0;
  local_128.data._M_elems[0x11] = 0;
  local_128.data._M_elems[0x12] = 0;
  local_128.data._M_elems[0x13] = 0;
  local_128.data._M_elems[0x14] = 0;
  local_128.data._M_elems[0x15] = 0;
  local_128.data._M_elems[0x16] = 0;
  local_128.data._M_elems[0x17] = 0;
  local_128.data._M_elems[0x18] = 0;
  local_128.data._M_elems[0x19] = 0;
  local_128.data._M_elems._104_5_ = 0;
  local_128.data._M_elems[0x1b]._1_3_ = 0;
  local_128.exp = 0;
  local_128.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_128,1.0);
  local_130._0_4_ = cpp_dec_float_finite;
  local_130._4_4_ = 0x1c;
  local_1a8 = (undefined1  [16])0x0;
  local_198 = (undefined1  [16])0x0;
  local_188 = (undefined1  [16])0x0;
  local_178 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_158 = (undefined1  [16])0x0;
  local_148[0] = 0;
  local_148[1] = 0;
  stack0xfffffffffffffec0 = 0;
  uStack_13b = 0;
  iStack_138 = 0;
  bStack_134 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_1a8,&local_128,&val->m_backend);
  pnVar6 = (this->diag).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar10 = (undefined4 *)local_1a8;
  pnVar9 = pnVar6 + p_row;
  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pnVar9->m_backend).data._M_elems[0] = *puVar10;
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
    pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar16 * -2 + 1) * 4);
  }
  pnVar6[p_row].m_backend.exp = iStack_138;
  pnVar6[p_row].m_backend.neg = bStack_134;
  pnVar6[p_row].m_backend.fpclass = (fpclass_type)local_130;
  pnVar6[p_row].m_backend.prec_elem = local_130._4_4_;
  pnVar8 = val;
  pcVar12 = &local_128;
  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pcVar12->data)._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
    pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar8 + ((ulong)bVar16 * -2 + 1) * 4);
    pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar16 * -2 + 1) * 4);
  }
  local_128.exp = (val->m_backend).exp;
  local_128.neg = (val->m_backend).neg;
  local_128.fpclass = (val->m_backend).fpclass;
  local_128.prec_elem = (val->m_backend).prec_elem;
  if ((local_128.neg == true) &&
     (local_128.fpclass != cpp_dec_float_finite || local_128.data._M_elems[0] != 0)) {
    local_128.neg = false;
  }
  a = Tolerances::epsilonPivot
                ((this->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((!NAN(a)) && (local_128.fpclass != cpp_dec_float_NaN)) {
    local_130._0_4_ = cpp_dec_float_finite;
    local_130._4_4_ = 0x1c;
    local_1a8 = ZEXT816(0);
    local_198 = ZEXT816(0);
    local_188 = ZEXT816(0);
    local_178 = ZEXT816(0);
    local_168 = ZEXT816(0);
    local_158 = ZEXT816(0);
    local_148[0] = 0;
    local_148[1] = 0;
    stack0xfffffffffffffec0 = 0;
    uStack_13b = 0;
    iStack_138 = 0;
    bStack_134 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_1a8,a);
    iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&local_128,(cpp_dec_float<200U,_int,_void> *)local_1a8);
    if (iVar5 < 0) {
      this->stat = SINGULAR;
    }
  }
  pnVar6 = (this->diag).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar9 = pnVar6 + p_row;
  puVar10 = local_a0;
  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar10 = (pnVar9->m_backend).data._M_elems[0];
    pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar16 * -2 + 1) * 4);
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
  }
  iVar5 = pnVar6[p_row].m_backend.exp;
  bVar15 = pnVar6[p_row].m_backend.neg;
  uVar4._0_4_ = pnVar6[p_row].m_backend.fpclass;
  uVar4._4_4_ = pnVar6[p_row].m_backend.prec_elem;
  local_130._0_4_ = cpp_dec_float_finite;
  local_130._4_4_ = 0x1c;
  iStack_138 = 0;
  bStack_134 = false;
  puVar10 = local_a0;
  puVar13 = (undefined4 *)local_1a8;
  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar13 = *puVar10;
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
    puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
  }
  bStack_134 = bVar15;
  if ((bVar15 == true) && (local_1a8._0_4_ != 0 || (fpclass_type)uVar4 != cpp_dec_float_finite)) {
    bStack_134 = false;
  }
  if (((fpclass_type)uVar4 != cpp_dec_float_NaN) &&
     ((this->maxabs).m_backend.fpclass != cpp_dec_float_NaN)) {
    iStack_138 = iVar5;
    local_130 = uVar4;
    iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      ((cpp_dec_float<200U,_int,_void> *)local_1a8,&(this->maxabs).m_backend);
    if (0 < iVar5) {
      pnVar6 = (this->diag).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start + p_row;
      uVar3 = (pnVar6->m_backend).data._M_elems[0];
      puVar11 = (uint *)((long)(pnVar6->m_backend).data._M_elems + 4);
      puVar14 = (uint *)local_1a8;
      for (lVar7 = 0x1b; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar14 = *puVar11;
        puVar11 = puVar11 + (ulong)bVar16 * -2 + 1;
        puVar14 = puVar14 + (ulong)bVar16 * -2 + 1;
      }
      iVar5 = (pnVar6->m_backend).exp;
      bVar15 = (pnVar6->m_backend).neg;
      uVar1 = (pnVar6->m_backend).fpclass;
      uVar2 = (pnVar6->m_backend).prec_elem;
      if (bVar15 == true) {
        bVar15 = uVar1 == 0 && uVar3 == 0;
      }
      (this->maxabs).m_backend.data._M_elems[0] = uVar3;
      puVar11 = (uint *)local_1a8;
      puVar14 = (this->maxabs).m_backend.data._M_elems + 1;
      for (lVar7 = 0x1b; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar14 = *puVar11;
        puVar11 = puVar11 + (ulong)bVar16 * -2 + 1;
        puVar14 = puVar14 + (ulong)bVar16 * -2 + 1;
      }
      (this->maxabs).m_backend.exp = iVar5;
      (this->maxabs).m_backend.neg = bVar15;
      (this->maxabs).m_backend.fpclass = uVar1;
      (this->maxabs).m_backend.prec_elem = uVar2;
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::setPivot(const int p_stage,
                            const int p_col,
                            const int p_row,
                            const R val)
{
   assert(row.perm[p_row] < 0);
   assert(col.perm[p_col] < 0);

   row.orig[p_stage] = p_row;
   col.orig[p_stage] = p_col;
   row.perm[p_row]   = p_stage;
   col.perm[p_col]   = p_stage;
   diag[p_row]       = R(1.0) / val;

   if(spxAbs(val) < _tolerances->epsilonPivot())
   {
#ifndef NDEBUG
      SPX_MSG_ERROR(std::cerr
                    << "LU pivot element is almost zero (< "
                    << _tolerances->epsilonPivot()
                    << ") - Basis is numerically singular"
                    << std::endl;)
#endif
      this->stat = SLinSolver<R>::SINGULAR;
   }

   if(spxAbs(diag[p_row]) > maxabs)
      maxabs = spxAbs(diag[p_row]);
}